

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.hpp
# Opt level: O2

void __thiscall
asio::detail::posix_thread::posix_thread<asio::detail::scheduler::thread_function>
          (posix_thread *this,thread_function f,uint param_2)

{
  func_base *arg;
  
  this->joined_ = false;
  arg = (func_base *)operator_new(0x10);
  arg->_vptr_func_base = (_func_int **)&PTR__func_base_004c1318;
  arg[1]._vptr_func_base = (_func_int **)f.this_;
  start_thread(this,arg);
  return;
}

Assistant:

posix_thread(Function f, unsigned int = 0)
    : joined_(false)
  {
    start_thread(new func<Function>(f));
  }